

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::ComputeFileNames(cmCTestLaunch *this)

{
  pointer pbVar1;
  char *pcVar2;
  string *psVar3;
  string *realArg;
  pointer str;
  cmCryptoHash md5;
  cmCryptoHash cStack_58;
  string local_48;
  
  pcVar2 = getenv("CTEST_LAUNCH_LOGS");
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    this->Passthru = false;
    psVar3 = &this->LogDir;
    std::__cxx11::string::assign((char *)psVar3);
    cmsys::SystemTools::ConvertToUnixSlashes(psVar3);
    std::__cxx11::string::append((char *)psVar3);
    cmCryptoHash::cmCryptoHash(&cStack_58,AlgoMD5);
    cmCryptoHash::Initialize(&cStack_58);
    cmCryptoHash::Append(&cStack_58,&this->CWD);
    pbVar1 = (this->RealArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (str = (this->RealArgs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; str != pbVar1; str = str + 1) {
      cmCryptoHash::Append(&cStack_58,str);
    }
    cmCryptoHash::FinalizeHex_abi_cxx11_(&local_48,&cStack_58);
    std::__cxx11::string::operator=((string *)&this->LogHash,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    psVar3 = &this->LogOut;
    std::__cxx11::string::_M_assign((string *)psVar3);
    std::__cxx11::string::append((char *)psVar3);
    std::__cxx11::string::append((string *)psVar3);
    std::__cxx11::string::append((char *)psVar3);
    psVar3 = &this->LogErr;
    std::__cxx11::string::_M_assign((string *)psVar3);
    std::__cxx11::string::append((char *)psVar3);
    std::__cxx11::string::append((string *)psVar3);
    std::__cxx11::string::append((char *)psVar3);
    cmCryptoHash::~cmCryptoHash(&cStack_58);
  }
  return;
}

Assistant:

void cmCTestLaunch::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  const char* d = getenv("CTEST_LAUNCH_LOGS");
  if (!(d && *d)) {
    return;
  }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  cmCryptoHash md5(cmCryptoHash::AlgoMD5);
  md5.Initialize();
  md5.Append(this->CWD);
  for (std::string const& realArg : this->RealArgs) {
    md5.Append(realArg);
  }
  this->LogHash = md5.FinalizeHex();

  // We store stdout and stderr in temporary log files.
  this->LogOut = this->LogDir;
  this->LogOut += "launch-";
  this->LogOut += this->LogHash;
  this->LogOut += "-out.txt";
  this->LogErr = this->LogDir;
  this->LogErr += "launch-";
  this->LogErr += this->LogHash;
  this->LogErr += "-err.txt";
}